

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

size_t sets_union<512ul,std::array<unsigned_long,2ul>>
                 (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets,
                 array<unsigned_long,_2UL> *c)

{
  pointer pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  
  pbVar1 = (binary_sets->
           super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                              pbVar1[c->_M_elems[0]].super__Base_bitset<8UL>._M_w);
  auVar3 = vporq_avx512f(auVar3,*(undefined1 (*) [64])
                                 pbVar1[c->_M_elems[1]].super__Base_bitset<8UL>._M_w);
  auVar3 = vpopcntq_avx512_vpopcntdq(auVar3);
  auVar2 = vpmovqb_avx512f(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar2._0_8_;
  auVar2 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
  return auVar2._0_8_;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}